

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void character_behaviour(tgestate_t *state,vischar_t *vischar)

{
  char cVar1;
  character_t cVar2;
  input_t iVar3;
  tgestate_t *in_RSI;
  tgestate_t *in_RDI;
  input_t input_1;
  input_t input;
  mappos8_t *target;
  mappos16_t *mappos;
  vischar_t *found;
  character_t bribed_character;
  uint8_t scale;
  uint8_t vischar2flags;
  vischar_t *vischar2;
  uint8_t iters;
  uint8_t counter_and_flags;
  uint8_t flags;
  vischar_t *in_stack_ffffffffffffffc8;
  tgestate_t *in_stack_ffffffffffffffd0;
  undefined5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffdf;
  tgestate_t *ptVar5;
  char local_13;
  
  bVar4 = *(byte *)((long)&in_RSI->height + 3);
  if ((bVar4 & 0xf) != 0) {
    *(byte *)((long)&in_RSI->height + 3) = bVar4 - 1;
    return;
  }
  cVar1 = *(char *)((long)&in_RSI->width + 1);
  ptVar5 = in_RSI;
  if (cVar1 == '\0') {
LAB_001118a7:
    if (*(char *)((long)&in_RSI->width + 2) == '\0') {
      character_behaviour_set_input(in_RDI,(vischar_t *)in_RSI,'\0');
      return;
    }
  }
  else {
    if (cVar1 != '\x01') {
      if (cVar1 != '\x02') {
        if (cVar1 == '\x03') {
          if ((in_RDI->item_structs[7].room_and_flags & 0x80) == 0) {
            *(undefined1 *)((long)&in_RSI->width + 1) = 0;
            *(undefined1 *)((long)&in_RSI->width + 2) = 0xff;
            *(undefined1 *)((long)&in_RSI->width + 3) = 0;
            get_target_assign_pos
                      (in_RSI,(vischar_t *)
                              CONCAT17(in_stack_ffffffffffffffdf,
                                       CONCAT16(in_stack_ffffffffffffffde,
                                                CONCAT15(in_stack_ffffffffffffffdd,
                                                         in_stack_ffffffffffffffd8))),
                       (route_t *)in_stack_ffffffffffffffd0);
            return;
          }
          *(uint8_t *)&in_RSI->height = in_RDI->item_structs[7].mappos.u;
          *(uint8_t *)((long)&in_RSI->height + 1) = in_RDI->item_structs[7].mappos.v;
          goto LAB_001118cd;
        }
        if (cVar1 == '\x04') {
          cVar2 = in_RDI->bribed_character;
          if (cVar2 != 0xff) {
            local_13 = '\a';
            in_stack_ffffffffffffffd0 = (tgestate_t *)(in_RDI->vischars + 1);
            do {
              if ((character_t)in_stack_ffffffffffffffd0->width == cVar2) {
                in_stack_ffffffffffffffc8 = (vischar_t *)in_stack_ffffffffffffffd0->jmpbuf_main;
                if (in_RDI->room_index == '\0') {
                  scale_mappos_down((mappos16_t *)in_stack_ffffffffffffffc8,
                                    (mappos8_t *)&in_RSI->height);
                }
                else {
                  *(char *)&in_RSI->height =
                       (char)((mappos16_t *)((__jmp_buf_tag *)in_stack_ffffffffffffffc8)->__jmpbuf)
                             ->u;
                  *(char *)((long)&in_RSI->height + 1) =
                       (char)((mappos16_t *)in_stack_ffffffffffffffd0->jmpbuf_main[0].__jmpbuf)->v;
                }
                goto LAB_001118cd;
              }
              in_stack_ffffffffffffffd0 =
                   (tgestate_t *)
                   ((long)((mappos16_t *)in_stack_ffffffffffffffd0->jmpbuf_main[0].__jmpbuf + 5) + 2
                   );
              local_13 = local_13 + -1;
            } while (local_13 != '\0');
          }
          *(undefined1 *)((long)&in_RSI->width + 1) = 0;
          get_target_assign_pos
                    (in_RSI,(vischar_t *)
                            CONCAT17(in_stack_ffffffffffffffdf,
                                     CONCAT16(in_stack_ffffffffffffffde,
                                              CONCAT15(cVar2,in_stack_ffffffffffffffd8))),
                     (route_t *)in_stack_ffffffffffffffd0);
          return;
        }
        goto LAB_001118a7;
      }
      if (in_RDI->automatic_player_counter == '\0') {
        *(undefined1 *)((long)&in_RSI->width + 1) = 0;
        get_target_assign_pos
                  (in_RSI,(vischar_t *)
                          CONCAT17(in_stack_ffffffffffffffdf,
                                   CONCAT16(in_stack_ffffffffffffffde,
                                            CONCAT15(in_stack_ffffffffffffffdd,
                                                     in_stack_ffffffffffffffd8))),
                   (route_t *)in_stack_ffffffffffffffd0);
        return;
      }
    }
    *(uint8_t *)&in_RSI->height = (in_RDI->hero_mappos).u;
    *(uint8_t *)((long)&in_RSI->height + 1) = (in_RDI->hero_mappos).v;
  }
LAB_001118cd:
  if (in_RDI->room_index == '\0') {
    if ((ptVar5->width & 0x4000) == 0) {
      bVar4 = 8;
    }
    else {
      bVar4 = 4;
    }
  }
  else {
    bVar4 = 1;
  }
  if ((in_RSI->height & 0x20000000) == 0) {
    iVar3 = vischar_move_u(in_RDI,(vischar_t *)in_RSI,(uint)bVar4);
    if (iVar3 == 0) {
      iVar3 = vischar_move_v(in_RDI,(vischar_t *)in_RSI,(uint)bVar4);
      if (iVar3 == 0) {
        target_reached(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      else {
        character_behaviour_set_input(in_RDI,(vischar_t *)in_RSI,(uint8_t)iVar3);
      }
    }
    else {
      character_behaviour_set_input(in_RDI,(vischar_t *)in_RSI,(uint8_t)iVar3);
    }
  }
  else {
    iVar3 = vischar_move_v(in_RDI,(vischar_t *)in_RSI,(uint)bVar4);
    if (iVar3 == 0) {
      iVar3 = vischar_move_u(in_RDI,(vischar_t *)in_RSI,(uint)bVar4);
      if (iVar3 == 0) {
        target_reached(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      else {
        character_behaviour_set_input(in_RDI,(vischar_t *)in_RSI,(uint8_t)iVar3);
      }
    }
    else {
      character_behaviour_set_input(in_RDI,(vischar_t *)in_RSI,(uint8_t)iVar3);
    }
  }
  return;
}

Assistant:

void character_behaviour(tgestate_t *state, vischar_t *vischar)
{
  uint8_t    flags;             /* was A */
  uint8_t    counter_and_flags; /* was B */
  uint8_t    iters;             /* was B */
  vischar_t *vischar2;          /* was HL */
  uint8_t    vischar2flags;     /* was C' */
  uint8_t    scale;             /* Conv: added */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Proceed into the character behaviour handling only when this delay field
   * hits zero. This stops characters navigating around obstacles too
   * quickly. */
  counter_and_flags = vischar->counter_and_flags; // Conv: Use of A dropped.
  if (counter_and_flags & vischar_BYTE7_COUNTER_MASK)
  {
    vischar->counter_and_flags = --counter_and_flags;
    return;
  }

  vischar2 = vischar; // no need for separate HL and IY now other code reduced
  flags = vischar2->flags;
  if (flags != 0)
  {
    /* Mode 1: Hero is chased by hostiles and sent to solitary if caught. */
    if (flags == vischar_PURSUIT_PURSUE)
    {
pursue_hero:
      /* Pursue the hero. */
      vischar2->target.u = state->hero_mappos.u;
      vischar2->target.v = state->hero_mappos.v;
      goto move;
    }
    /* Mode 2: Hero is chased by hostiles if under player control. */
    else if (flags == vischar_PURSUIT_HASSLE)
    {
      if (state->automatic_player_counter > 0)
      {
        /* The hero is under player control: pursue. */
        goto pursue_hero;
      }
      else
      {
        /* The hero is under automatic control: hostiles lose interest and
         * resume following their original route. */
        vischar2->flags = 0; /* clear vischar_PURSUIT_HASSLE */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 3: The food item is near a guard dog. */
    else if (flags == vischar_PURSUIT_DOG_FOOD)
    {
      if (state->item_structs[item_FOOD].room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
      {
        /* Set dog target to poisoned food. */
        vischar2->target.u = state->item_structs[item_FOOD].mappos.u;
        vischar2->target.v = state->item_structs[item_FOOD].mappos.v;
        goto move;
      }
      else
      {
        /* Food is no longer nearby: Choose random locations in the fenced-
         * off area (right side). */
        vischar2->flags = 0; /* clear vischar_PURSUIT_DOG_FOOD */
        vischar2->route.index = routeindex_255_WANDER;
        vischar2->route.step  = 0; /* 0..7 */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 4: Hostile character witnessed a bribe being given (in accept_bribe). */
    else if (flags == vischar_PURSUIT_SAW_BRIBE)
    {
      character_t  bribed_character; /* was A */
      vischar_t   *found;            /* was HL */

      bribed_character = state->bribed_character;
      if (bribed_character != character_NONE)
      {
        /* Iterate over non-player characters. */
        iters = vischars_LENGTH - 1;
        found = &state->vischars[1];
        do
        {
          if (found->character == bribed_character)
            goto bribed_visible;
          found++;
        }
        while (--iters);
      }

      /* Bribed character was not visible: hostiles lose interest and resume
       * following their original route. */
      vischar2->flags = 0; /* clear vischar_PURSUIT_SAW_BRIBE */
      get_target_assign_pos(state, vischar2, &vischar2->route);
      return;

bribed_visible:
      /* Found the bribed character in vischars: hostiles target him. */
      {
        mappos16_t *mappos; /* was HL */
        mappos8_t  *target; /* was DE */

        mappos = &found->mi.mappos;
        target = &vischar2->target;
        if (state->room_index == room_0_OUTDOORS)
        {
          /* Outdoors */
          scale_mappos_down(mappos, target);
        }
        else
        {
          /* Indoors */
          target->u = mappos->u; // note: narrowing
          target->v = mappos->v; // note: narrowing
        }
        goto move;
      }
    }
  }

  if (vischar2->route.index == routeindex_0_HALT) /* Stand still */
  {
    character_behaviour_set_input(state, vischar, 0 /* new_input */);
    return; /* was tail call */
  }

move:
  vischar2flags = vischar2->flags; // sampled = $8081, 80a1, 80e1, 8001, 8021, ...

  /* Conv: The original code here self modifies the vischar_move_u/v routines.
   *       The replacement code passes in a scale factor. */
  if (state->room_index > room_0_OUTDOORS)
    scale = 1; /* Indoors. */
  else if (vischar2flags & vischar_FLAGS_TARGET_IS_DOOR)
    scale = 4; /* Outdoors + door thing. */
  else
    scale = 8; /* Outdoors. */

  /* If the vischar_BYTE7_V_DOMINANT flag is set then we try moving on the v
   * axis then the u axis, rather than u then v. This is the code which makes
   * characters alternate left/right when navigating. */
  if (vischar->counter_and_flags & vischar_BYTE7_V_DOMINANT)
  {
    /* V dominant case */

    /* Conv: Inlined the chunk from $C9FF here. */

    input_t input; /* was A */

    input = vischar_move_v(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_u(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
  else
  {
    /* U dominant case */

    input_t input; /* was A */

    input = vischar_move_u(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_v(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
}